

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_when(lysp_ctx *ctx,lysp_stmt *stmt,lysp_when **when_p)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_when *str_p;
  char *pcVar3;
  ly_ctx *local_80;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_when *when;
  LY_ERR ret;
  lysp_when **when_p_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if (*when_p == (lysp_when *)0x0) {
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      str_p = (lysp_when *)calloc(1,0x20);
      if (str_p == (lysp_when *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_68 = (ly_ctx *)0x0;
        }
        else {
          local_68 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_68,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_when");
        ctx_local._4_4_ = LY_EMEM;
      }
      else {
        *when_p = str_p;
        if (ctx == (lysp_ctx *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ctx_local._4_4_ = lydict_insert(local_70,stmt->arg,0,(char **)str_p);
        if (ctx_local._4_4_ == LY_SUCCESS) {
          for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
            lVar1 = _ret___3->kw;
            if (lVar1 == LY_STMT_DESCRIPTION) {
              LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->dsc,Y_STR_ARG,&str_p->exts);
            }
            else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
              LVar2 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_WHEN,0,&str_p->exts);
            }
            else {
              if (lVar1 != LY_STMT_REFERENCE) {
                if (ctx == (lysp_ctx *)0x0) {
                  local_80 = (ly_ctx *)0x0;
                }
                else {
                  local_80 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar3 = lyplg_ext_stmt2str(_ret___3->kw);
                ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"when");
                return LY_EVALID;
              }
              LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->ref,Y_STR_ARG,&str_p->exts);
            }
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          }
          ctx_local._4_4_ = LY_SUCCESS;
        }
      }
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_60 = (ly_ctx *)0x0;
    }
    else {
      local_60 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","when");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_when(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_when **when_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_when *when;

    if (*when_p) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "when");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    when = calloc(1, sizeof *when);
    LY_CHECK_ERR_RET(!when, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    *when_p = when;

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &when->cond));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &when->dsc, Y_STR_ARG, &when->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &when->ref, Y_STR_ARG, &when->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_WHEN, 0, &when->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "when");
            return LY_EVALID;
        }
    }
    return ret;
}